

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportSolverProgress(HModel *this)

{
  HTimer *this_00;
  int *in_RDI;
  double dVar1;
  double dVar2;
  double currentTime;
  HTimer *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  uint uVar3;
  HModel *in_stack_ffffffffffffffe0;
  undefined8 uVar4;
  
  if ((*in_RDI != 0) &&
     (dVar1 = HTimer::getTime(in_stack_ffffffffffffffd0),
     util_reportSolverProgress::nextReport <= dVar1)) {
    computeDuObj(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    this_00 = (HTimer *)std::__cxx11::string::c_str();
    uVar4 = *(undefined8 *)(in_RDI + 0x164);
    uVar3 = in_RDI[0x162];
    dVar2 = HTimer::getTime(this_00);
    printf("PROGRESS %16s %20.10e %10d %10.3f\n",uVar4,dVar2,this_00,(ulong)uVar3);
    if (50.0 <= dVar1) {
      if (500.0 <= dVar1) {
        dVar1 = (double)(int)(dVar1 * 0.2 + 1.0) / 0.2;
      }
      else {
        dVar1 = (double)(int)(dVar1 + 1.0);
      }
    }
    else {
      dVar1 = (double)(int)(dVar1 * 5.0 + 1.0) / 5.0;
    }
    util_reportSolverProgress::nextReport = dVar1 - 1e-05;
  }
  return;
}

Assistant:

void HModel::util_reportSolverProgress() {
  if (!intOption[INTOPT_PRINT_FLAG]) return;
  static double nextReport = 0;
  double currentTime = timer.getTime();
  if (currentTime >= nextReport) {
    computeDuObj();
    printf("PROGRESS %16s %20.10e %10d %10.3f\n", modelName.c_str(),
	   objective, numberIteration, timer.getTime());
    if (currentTime < 50) {
      nextReport = ((int) (5 * currentTime + 1)) / 5.0 - 0.00001;
    } else if (currentTime < 500) {
      nextReport = ((int) (currentTime + 1)) - 0.00001;
    } else {
      nextReport = ((int) (0.2 * currentTime + 1)) / 0.2 - 0.00001;
    }
  }
}